

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_catalog_set.cpp
# Opt level: O1

bool __thiscall
duckdb::DependencyCatalogSet::DropEntry
          (DependencyCatalogSet *this,CatalogTransaction transaction,MangledEntryName *name,
          bool cascade,bool allow_drop_internal)

{
  bool bVar1;
  string local_40;
  
  MangledDependencyName::MangledDependencyName
            ((MangledDependencyName *)&local_40,&this->mangled_name,name);
  bVar1 = CatalogSet::DropEntry(this->set,transaction,&local_40,cascade,allow_drop_internal);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool DependencyCatalogSet::DropEntry(CatalogTransaction transaction, const MangledEntryName &name, bool cascade,
                                     bool allow_drop_internal) {
	auto new_name = ApplyPrefix(name);
	return set.DropEntry(transaction, new_name.name, cascade, allow_drop_internal);
}